

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bte.h
# Opt level: O2

void __thiscall merlin::bte::~bte(bte *this)

{
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__bte_001973b0;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&DAT_00197448;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_cluster2var)._M_t);
  std::
  vector<std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>,_std::allocator<std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>_>_>
  ::~vector(&this->m_separators);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->m_edge_indeces);
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&(this->m_schedule).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_backward);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_forward);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&this->m_roots);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&this->m_out);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&this->m_in);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&this->m_scopes)
  ;
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&this->m_originals);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&this->m_clusters);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->m_types).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_best_config).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_beliefs);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->m_var_types).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_parents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  graphical_model::~graphical_model(&this->m_gmo);
  graphical_model::~graphical_model(&this->super_graphical_model);
  return;
}

Assistant:

~bte() {}